

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O2

boolean l2_absorb_expr_atom(void)

{
  boolean bVar1;
  boolean bVar2;
  l2_token *plVar3;
  
  bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_LP);
  if (bVar1 == '\0') {
    bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_IDENTIFIER);
    if (bVar1 == '\0') {
      bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_INTEGER_LITERAL);
      if ((((bVar1 == '\0') &&
           (bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_REAL_LITERAL), bVar1 == '\0')) &&
          (bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_STRING_LITERAL), bVar1 == '\0')) &&
         ((bVar1 = l2_parse_probe_next_token_by_type_and_str
                             (L2_TOKEN_KEYWORD,g_l2_token_keywords[0]), bVar1 == '\0' &&
          (bVar1 = l2_parse_probe_next_token_by_type_and_str
                             (L2_TOKEN_KEYWORD,g_l2_token_keywords[1]), bVar1 == '\0')))) {
        return '\0';
      }
      l2_parse_token_forward();
      return '\x01';
    }
    l2_parse_token_forward();
    bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_LP);
    bVar1 = '\x01';
    if (bVar2 == '\0') {
      return '\x01';
    }
    l2_parse_token_forward();
    l2_absorb_real_param_list();
  }
  else {
    l2_parse_token_forward();
    bVar1 = l2_absorb_expr_comma();
  }
  bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_RP);
  l2_parse_token_forward();
  if (bVar2 != '\0') {
    return bVar1;
  }
  plVar3 = l2_parse_token_current();
  l2_parsing_error(L2_PARSING_ERROR_MISSING_RP,plVar3->current_line,plVar3->current_col);
}

Assistant:

_if_type (L2_TOKEN_LP)
    {
        boolean inner_res = l2_absorb_expr();
        _if_type (L2_TOKEN_RP)
        { }
        _throw_missing_rp

        return inner_res;
    }